

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::ByteData256::ByteData256(ByteData256 *this,ByteData *byte_data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  ByteData *local_18;
  ByteData *byte_data_local;
  ByteData256 *this_local;
  
  local_18 = byte_data;
  byte_data_local = (ByteData *)this;
  ByteData::GetBytes(&local_30,byte_data);
  ByteData256(this,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  return;
}

Assistant:

ByteData256::ByteData256(const ByteData& byte_data)
    : ByteData256(byte_data.GetBytes()) {}